

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O1

char * __thiscall TadsHttpReqResult::next_header(TadsHttpReqResult *this,char *p)

{
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  
  pbVar2 = (byte *)(p + 2);
  do {
    if (pbVar2[-2] == 0xd) {
      if (pbVar2[-1] == 10) {
        bVar3 = *pbVar2;
        while( true ) {
          if (bVar3 == 0) {
            return (char *)0x0;
          }
          if (((char)bVar3 < '\0') || (iVar1 = isspace((uint)bVar3), iVar1 == 0)) break;
          bVar3 = pbVar2[1];
          pbVar2 = pbVar2 + 1;
        }
        if (bVar3 == 0) {
          return (char *)0x0;
        }
        if (bVar3 != 0xd) {
          return (char *)pbVar2;
        }
        if (pbVar2[1] == 10) {
          return (char *)0x0;
        }
        return (char *)pbVar2;
      }
    }
    else if (pbVar2[-2] == 0) {
      return (char *)0x0;
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

const char *next_header(const char *p)
    {
        /* scan ahead to the next \r\n sequence */
        for ( ; *p != '\0' ; ++p)
        {
            /* if this is a CR-LF sequence, it's the end of this header */
            if (*p == '\r' && *(p+1) == '\n')
            {
                /* skip spaces */
                for (p += 2 ; *p != '\0' && is_space(*p) ; ++p) ;

                /* if this was a blank line, we're out of headers */
                if (*p == '\0' || (*p == '\r' && *(p+1) == '\n'))
                    return 0;

                /* this is the next header */
                return p;
            }
        }

        /* no more headers */
        return 0;
    }